

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::OptionAlreadyAdded::OptionAlreadyAdded
          (OptionAlreadyAdded *this,string *msg,ExitCodes exit_code)

{
  allocator local_69;
  string local_68;
  string local_48;
  
  ::std::__cxx11::string::string((string *)&local_48,"OptionAlreadyAdded",&local_69);
  ::std::__cxx11::string::string((string *)&local_68,(string *)msg);
  ConstructionError::ConstructionError(&this->super_ConstructionError,&local_48,&local_68,exit_code)
  ;
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_ConstructionError).super_Error = &PTR__Error_0015c668;
  return;
}

Assistant:

OptionAlreadyAdded(std::string name)
        : OptionAlreadyAdded(name + " is already added", ExitCodes::OptionAlreadyAdded) {}